

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>::
truncate(ArrayBuilder<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry>
         *this,char *__file,__off_t __length)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = *(long *)this;
  uVar2 = *(ulong *)(this + 8);
  while ((ulong)((long)__file * 0x28 + lVar1) < uVar2) {
    *(ulong *)(this + 8) = uVar2 - 0x28;
    lVar3 = *(long *)(uVar2 - 0x20);
    if (lVar3 != 0) {
      lVar4 = *(long *)(uVar2 - 0x18);
      lVar5 = *(long *)(uVar2 - 0x10);
      *(undefined8 *)(uVar2 - 0x20) = 0;
      *(undefined8 *)(uVar2 - 0x18) = 0;
      *(undefined8 *)(uVar2 - 0x10) = 0;
      (**(code **)**(undefined8 **)(uVar2 - 8))
                (*(undefined8 **)(uVar2 - 8),lVar3,8,lVar4 - lVar3 >> 3,lVar5 - lVar3 >> 3,0);
    }
    uVar2 = *(ulong *)(this + 8);
  }
  return (int)uVar2;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }